

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

pair<unsigned_long,_duckdb::string_t> * __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
::_Pool::Release(_Pool *this,
                Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
                *pNode)

{
  pair<unsigned_long,_duckdb::string_t> *ppVar1;
  Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
  *in_RDX;
  long in_RSI;
  pair<unsigned_long,_duckdb::string_t> *in_RDI;
  pair<unsigned_long,_duckdb::string_t> *result;
  Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
  *local_10 [2];
  
  local_10[0] = in_RDX;
  ppVar1 = Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
           ::value(in_RDX);
  in_RDI->first = ppVar1->first;
  *(undefined8 *)&(in_RDI->second).value = *(undefined8 *)&(ppVar1->second).value;
  (in_RDI->second).value.pointer.ptr = (ppVar1->second).value.pointer.ptr;
  std::
  swap<duckdb_skiplistlib::skip_list::Node<std::pair<unsigned_long,duckdb::string_t>,duckdb::SkipLess<std::pair<unsigned_long,duckdb::string_t>>>*>
            (local_10,(Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
                       **)(in_RSI + 8));
  if (local_10[0] !=
      (Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
       *)0x0) {
    ~Node((Node<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
           *)0xa58b14);
    operator_delete(local_10[0]);
  }
  return in_RDI;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}